

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.c
# Opt level: O2

int equalizer_segment_free(mixed_segment *segment)

{
  void *pvVar1;
  
  pvVar1 = segment->data;
  if (pvVar1 != (void *)0x0) {
    free_fft_window_data((fft_window_data *)((long)pvVar1 + 0x10));
    (*mixed_free)(pvVar1);
  }
  segment->data = (void *)0x0;
  return 1;
}

Assistant:

int equalizer_segment_free(struct mixed_segment *segment){
  struct equalizer_segment_data *data = (struct equalizer_segment_data *)segment->data;
  if(data){
    free_fft_window_data(&data->fft_window_data);
    mixed_free(data);
  }
  segment->data = 0;
  return 1;
}